

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O0

void treatstackoption(lua_State *L,lua_State *L1,char *fname)

{
  undefined8 in_RDX;
  int idx;
  lua_State *in_RSI;
  lua_State *in_RDI;
  char *in_stack_00000020;
  int in_stack_0000002c;
  lua_State *in_stack_00000030;
  
  idx = (int)((ulong)in_RDX >> 0x20);
  if (in_RDI == in_RSI) {
    lua_pushvalue((lua_State *)fname,(int)((ulong)in_RDI >> 0x20));
    lua_remove(in_RSI,idx);
  }
  else {
    lua_xmove((lua_State *)fname,in_RDI,(int)((ulong)in_RSI >> 0x20));
  }
  lua_setfield(in_stack_00000030,in_stack_0000002c,in_stack_00000020);
  return;
}

Assistant:

static void treatstackoption(lua_State *L, lua_State *L1, const char *fname)
{
  if (L == L1) {
    lua_pushvalue(L, -2);
    lua_remove(L, -3);
  }
  else
    lua_xmove(L1, L, 1);
  lua_setfield(L, -2, fname);
}